

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEException.cpp
# Opt level: O0

void __thiscall
CEException::sofa_exception::sofa_exception
          (sofa_exception *this,string *origin,string *sofa_method,string *message)

{
  string *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long *in_RDI;
  string *message_00;
  string *in_stack_ffffffffffffff48;
  CEExceptionHandler *in_stack_ffffffffffffff50;
  string local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  string local_78 [55];
  undefined1 local_41 [65];
  
  message_00 = (string *)local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_41 + 1),"SOFA exception",(allocator *)message_00);
  CEExceptionHandler::CEExceptionHandler
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,message_00,in_RCX);
  std::__cxx11::string::~string((string *)(local_41 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_41);
  *in_RDI = (long)&PTR__sofa_exception_00159940;
  std::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::operator+(in_RCX,(char *)in_RSI);
  std::operator+(in_RCX,in_RSI);
  (**(code **)(*in_RDI + 0x20))(in_RDI,local_78);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
  return;
}

Assistant:

CEException::sofa_exception::sofa_exception(const std::string& origin,
                                            const std::string& sofa_method,
                                            const std::string& message) :
    CEExceptionHandler(origin, message, "SOFA exception")
{
    // Overwrite the message
    this->message("SOFA method: " + sofa_method + "; " + message);
}